

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDUint32x4Operation::OpFromFloat32x4(SIMDValue *value,bool *throws)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 in_EAX;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar10;
  float fVar11;
  undefined1 auVar9 [16];
  float fVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  SIMDValue SVar18;
  
  fVar1 = (value->field_0).f32[0];
  fVar2 = (value->field_0).f32[1];
  fVar3 = (value->field_0).f32[2];
  fVar4 = (value->field_0).f32[3];
  auVar9._4_4_ = -(uint)(fVar2 <= -1.0);
  auVar9._0_4_ = -(uint)(fVar1 <= -1.0);
  auVar9._8_4_ = -(uint)(fVar3 <= -1.0);
  auVar9._12_4_ = -(uint)(fVar4 <= -1.0);
  iVar5 = movmskps(in_EAX,auVar9);
  if (iVar5 == 0) {
    fVar8 = (float)(-(uint)(2.1474836e+09 <= fVar1) & 0x4f000000);
    fVar10 = (float)(-(uint)(2.1474836e+09 <= fVar2) & 0x4f000000);
    fVar11 = (float)(-(uint)(2.1474836e+09 <= fVar3) & 0x4f000000);
    fVar12 = (float)(-(uint)(2.1474836e+09 <= fVar4) & 0x4f000000);
    iVar13 = (int)(fVar1 - fVar8);
    iVar14 = (int)(fVar2 - fVar10);
    iVar15 = (int)(fVar3 - fVar11);
    iVar16 = (int)(fVar4 - fVar12);
    auVar17._0_4_ = -(uint)(iVar13 == -0x80000000);
    auVar17._4_4_ = -(uint)(iVar14 == -0x80000000);
    auVar17._8_4_ = -(uint)(iVar15 == -0x80000000);
    auVar17._12_4_ = -(uint)(iVar16 == -0x80000000);
    iVar5 = movmskps(0,auVar17);
    if (iVar5 == 0) {
      iVar13 = iVar13 + ((int)fVar8 * 2 & 0x80000000U);
      iVar14 = iVar14 + ((int)fVar10 * 2 & 0x80000000U);
      iVar15 = iVar15 + ((int)fVar11 * 2 & 0x80000000U);
      iVar16 = iVar16 + ((int)fVar12 * 2 & 0x80000000U);
    }
    else {
      *throws = true;
    }
    uVar6 = CONCAT44(iVar14,iVar13);
    uVar7 = CONCAT44(iVar16,iVar15);
  }
  else {
    *throws = true;
    uVar6 = 0;
    uVar7 = 0;
  }
  SVar18.field_0.f64[1] = (Type)uVar7;
  SVar18.field_0.f64[0] = (Type)uVar6;
  return (SIMDValue)SVar18.field_0;
}

Assistant:

SIMDValue SIMDUint32x4Operation::OpFromFloat32x4(const SIMDValue& value, bool& throws)
    {
        X86SIMDValue x86Result = { 0 };
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);
        X86SIMDValue temp, temp2;
        X86SIMDValue two_31_f4, two_31_i4;
        int mask = 0;

        // any lanes <= -1.0 ?
        temp.m128_value = _mm_cmple_ps(v.m128_value, X86_ALL_NEG_ONES_F4.m128_value);
        mask = _mm_movemask_ps(temp.m128_value);
        // negative value are out of range, caller should throw Range Error
        if (mask)
        {
            throws = true;
            return X86SIMDValue::ToSIMDValue(x86Result);
        }
        // CVTTPS2DQ does a range check over signed range [-2^31, 2^31-1], so will fail to convert values >= 2^31.
        // To fix this, subtract 2^31 from values >= 2^31, do CVTTPS2DQ, then add 2^31 back.
        _mm_store_ps(two_31_f4.f32, X86_TWO_31_F4.m128_value);
        // any lanes >= 2^31 ?
        temp.m128_value = _mm_cmpge_ps(v.m128_value, two_31_f4.m128_value);
        // two_31_f4 has f32(2^31) for lanes >= 2^31, 0 otherwise
        two_31_f4.m128_value = _mm_and_ps(two_31_f4.m128_value, temp.m128_value);
        // subtract 2^31 from lanes >= 2^31, unchanged otherwise.
        v.m128_value = _mm_sub_ps(v.m128_value, two_31_f4.m128_value);

        // CVTTPS2DQ
        x86Result.m128i_value = _mm_cvttps_epi32(v.m128_value);

        // check if any value is out of range (i.e. >= 2^31, meaning originally >= 2^32 before value adjustment)
        temp2.m128i_value = _mm_cmpeq_epi32(x86Result.m128i_value, X86_NEG_MASK_F4.m128i_value); // any value == 0x80000000 ?
        mask = _mm_movemask_ps(temp2.m128_value);
        if (mask)
        {
            throws = true;
            return X86SIMDValue::ToSIMDValue(x86Result);
        }
        // we pass range check

        // add 2^31 values back to adjusted values.
        // Use first bit from the 2^31 float mask (0x4f000...0 << 1)
        // and result with 2^31 int mask (0x8000..0) setting first bit to zero if lane hasn't been adjusted
        _mm_store_ps(two_31_i4.f32, X86_TWO_31_I4.m128_value);
        two_31_f4.m128i_value = _mm_slli_epi32(two_31_f4.m128i_value, 1);
        two_31_i4.m128i_value = _mm_and_si128(two_31_i4.m128i_value, two_31_f4.m128i_value);
        // add 2^31 back to adjusted values
        // Note at this point all values are in [0, 2^31-1]. Adding 2^31 is guaranteed not to overflow.
        x86Result.m128i_value = _mm_add_epi32(x86Result.m128i_value, two_31_i4.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }